

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall cmCTestScriptHandler::CheckOutSourceDir(cmCTestScriptHandler *this)

{
  OutputOption outputflag;
  cmCTest *this_00;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  rep_conflict local_1f8;
  undefined1 local_1e9;
  string local_1e8 [7];
  bool res;
  undefined1 local_1c8 [8];
  ostringstream cmCTestLog_msg;
  int local_3c;
  undefined1 local_38 [4];
  int retVal;
  string output;
  cmCTestScriptHandler *this_local;
  
  output.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = cmsys::SystemTools::FileExists(&this->SourceDir);
  if ((!bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::__cxx11::string::clear();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar3 = std::operator<<((ostream *)local_1c8,"Run cvs: ");
    poVar3 = std::operator<<(poVar3,(string *)&this->CVSCheckOut);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x23e,pcVar4,false);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    outputflag = (this->super_cmCTestGenericHandler).HandlerVerbose;
    local_1f8 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
    local_1e9 = cmSystemTools::RunSingleCommand
                          (&this->CVSCheckOut,(string *)local_38,(string *)local_38,&local_3c,pcVar4
                           ,outputflag,(cmDuration)local_1f8);
    if ((!(bool)local_1e9) || (local_3c != 0)) {
      std::operator+(&local_218,"Unable to perform cvs checkout:\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      cmSystemTools::Error(&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      this_local._4_4_ = 6;
      goto LAB_003feecb;
    }
  }
  this_local._4_4_ = 0;
LAB_003feecb:
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmCTestScriptHandler::CheckOutSourceDir()
{
  std::string output;
  int retVal;

  if (!cmSystemTools::FileExists(this->SourceDir) &&
      !this->CVSCheckOut.empty()) {
    // we must now checkout the src dir
    output.clear();
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run cvs: " << this->CVSCheckOut << std::endl);
    bool res = cmSystemTools::RunSingleCommand(
      this->CVSCheckOut, &output, &output, &retVal, this->CTestRoot.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);
    if (!res || retVal != 0) {
      cmSystemTools::Error("Unable to perform cvs checkout:\n" + output);
      return 6;
    }
  }
  return 0;
}